

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O1

void duckdb::udf_binary_function<double>(DataChunk *input,ExpressionState *state,Vector *result)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  reference pvVar5;
  ulong uVar6;
  
  duckdb::DataChunk::Flatten();
  duckdb::Vector::SetVectorType((VectorType)result);
  lVar1 = *(long *)(result + 0x20);
  pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,1);
  lVar2 = *(long *)(pvVar5 + 0x20);
  pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,1);
  FlatVector::VerifyFlatVector(pvVar5);
  FlatVector::VerifyFlatVector(result);
  *(undefined8 *)(result + 0x28) = *(undefined8 *)(pvVar5 + 0x28);
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30),
             (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(pvVar5 + 0x30));
  *(undefined8 *)(result + 0x40) = *(undefined8 *)(pvVar5 + 0x40);
  uVar3 = *(ulong *)(input + 0x18);
  if (uVar3 != 0) {
    lVar4 = *(long *)(pvVar5 + 0x28);
    uVar6 = 0;
    do {
      if ((lVar4 == 0) || ((*(ulong *)(lVar4 + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0)) {
        *(undefined8 *)(lVar1 + uVar6 * 8) = *(undefined8 *)(lVar2 + uVar6 * 8);
      }
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  return;
}

Assistant:

static void udf_binary_function(DataChunk &input, ExpressionState &state, Vector &result) {
	input.Flatten();
	switch (GetTypeId<TYPE>()) {
	case PhysicalType::VARCHAR: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<string_t>(result);
		auto ldata = FlatVector::GetData<string_t>(input.data[1]);
		auto &validity = FlatVector::Validity(input.data[0]);

		FlatVector::SetValidity(result, FlatVector::Validity(input.data[1]));

		for (idx_t i = 0; i < input.size(); i++) {
			if (!validity.RowIsValid(i)) {
				continue;
			}
			auto input_length = ldata[i].GetSize();
			string_t target = StringVector::EmptyString(result, input_length);
			auto target_data = target.GetDataWriteable();
			memcpy(target_data, ldata[i].GetData(), input_length);
			target.Finalize();
			result_data[i] = target;
		}
		break;
	}
	default: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<TYPE>(result);
		auto ldata = FlatVector::GetData<TYPE>(input.data[1]);
		auto &mask = FlatVector::Validity(input.data[1]);
		FlatVector::SetValidity(result, mask);

		for (idx_t i = 0; i < input.size(); i++) {
			if (!mask.RowIsValid(i)) {
				continue;
			}
			result_data[i] = ldata[i];
		}
	}
	}
}